

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

Filter * helics::generateTranslator
                   (Federate *fed,bool global,string_view name,TranslatorTypes ttype,
                   string_view endpointType,string_view units)

{
  Filter *this;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,global) == 0) {
    this = Federate::registerTranslator(fed,0,name,endpointType,units);
  }
  else {
    this = Federate::registerGlobalTranslator(fed,0,name,endpointType,units);
  }
  if (ttype != CUSTOM) {
    Translator::setTranslatorType((Translator *)this,ttype);
  }
  return this;
}

Assistant:

static Translator& generateTranslator(Federate* fed,
                                      bool global,
                                      std::string_view name,
                                      TranslatorTypes ttype,
                                      std::string_view endpointType,
                                      std::string_view units)
{
    Translator& trans = (global) ? fed->registerGlobalTranslator(name, endpointType, units) :
                                   fed->registerTranslator(name, endpointType, units);
    if (ttype != TranslatorTypes::CUSTOM) {
        trans.setTranslatorType(static_cast<std::int32_t>(ttype));
    }
    return trans;
}